

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_christmas_event.hpp
# Opt level: O1

void __thiscall PatchChristmasEvent::load_from_rom(PatchChristmasEvent *this,ROM *rom)

{
  uint8_t *in_stack_ffffffffffffffa8;
  Color aCStack_50 [2];
  long local_48;
  void *pvStack_40;
  Color local_38 [2];
  long lStack_30;
  Color local_28 [2];
  Color aCStack_20 [2];
  
  ColorPalette<16UL>::from_rom((ColorPalette<16UL> *)&stack0xffffffffffffffa8,rom,0x3deca);
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xc) = local_28;
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 0xe) = aCStack_20;
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 8) = local_38;
  *(long *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 10) = lStack_30;
  *(long *)((this->_title_palette).super_array<Color,_16UL>._M_elems + 4) = local_48;
  *(void **)((this->_title_palette).super_array<Color,_16UL>._M_elems + 6) = pvStack_40;
  *(uint8_t **)(this->_title_palette).super_array<Color,_16UL>._M_elems = in_stack_ffffffffffffffa8;
  *(Color (*) [2])((this->_title_palette).super_array<Color,_16UL>._M_elems + 2) = aCStack_50;
  Sprite::decode_from(in_stack_ffffffffffffffa8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->_moneybag_sprite)._data,&stack0xffffffffffffffa8);
  std::vector<SubSpriteMetadata,_std::allocator<SubSpriteMetadata>_>::_M_move_assign
            (&(this->_moneybag_sprite)._subsprites,&pvStack_40);
  if (pvStack_40 != (void *)0x0) {
    operator_delete(pvStack_40,lStack_30 - (long)pvStack_40);
  }
  if (in_stack_ffffffffffffffa8 != (uint8_t *)0x0) {
    operator_delete(in_stack_ffffffffffffffa8,local_48 - (long)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void load_from_rom(const md::ROM& rom) override
    {
        _title_palette = ColorPalette<16>::from_rom(rom, 0x3DECA);

        constexpr uint32_t MONEYBAG_SPRITE_ADDR = 0x151CC4;
        _moneybag_sprite = Sprite::decode_from(rom.iterator_at(MONEYBAG_SPRITE_ADDR));
    }